

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTextDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *text_dir)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_2dPoint *this_00;
  ON_2dPoint *p;
  ON_2dVector OVar4;
  double local_38;
  double local_30;
  int local_24;
  int i;
  int point_count;
  bool rc;
  ON_2dVector *text_dir_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  iVar3 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  iVar1 = iVar3;
  if (iVar3 < 2) {
    ON_2dVector::Set(text_dir,-1.0,0.0);
  }
  else {
    while (local_24 = iVar1 + -1, 0 < local_24) {
      this_00 = ON_SimpleArray<ON_2dPoint>::operator[]
                          (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                            super_ON_SimpleArray<ON_2dPoint>,iVar3 + -1);
      p = ON_SimpleArray<ON_2dPoint>::operator[]
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>,iVar1 + -2);
      OVar4 = ON_2dPoint::operator-(this_00,p);
      local_38 = OVar4.x;
      text_dir->x = local_38;
      local_30 = OVar4.y;
      text_dir->y = local_30;
      bVar2 = ON_2dVector::Unitize(text_dir);
      if (bVar2) {
        return true;
      }
      ON_2dVector::Set(text_dir,-1.0,0.0);
      iVar1 = local_24;
    }
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTextDirection( ON_2dVector& text_dir ) const 
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    text_dir.Set(-1.0,0.0);
  }
  else
  {
    int i; // 20 June 2011 Fixed textdir for leaders with 2 points. rr86801
    for(i = point_count-1; i >= 1; i--)
    {
      text_dir = m_points[point_count-1] -  m_points[i-1];
      if(text_dir.Unitize())
      {
        rc = true;
        break;
      }
      text_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}